

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

void return_free_node(lua_State *L,int pool,socket_buffer *sb)

{
  buffer_node *p;
  buffer_node *pbVar1;
  buffer_node *free_node;
  socket_buffer *sb_local;
  int pool_local;
  lua_State *L_local;
  
  p = sb->head;
  sb->offset = 0;
  sb->head = p->next;
  if (sb->head == (buffer_node *)0x0) {
    sb->tail = (buffer_node *)0x0;
  }
  lua_rawgeti(L,pool,1);
  pbVar1 = (buffer_node *)lua_touserdata(L,-1);
  p->next = pbVar1;
  lua_settop(L,-2);
  free(p->msg);
  p->msg = (char *)0x0;
  p->sz = 0;
  lua_pushlightuserdata(L,p);
  lua_rawseti(L,pool,1);
  return;
}

Assistant:

static void
return_free_node(lua_State *L, int pool, struct socket_buffer *sb) {
	struct buffer_node *free_node = sb->head;
	sb->offset = 0;
	sb->head = free_node->next;
	if (sb->head == NULL) {
		sb->tail = NULL;
	}
	lua_rawgeti(L,pool,1);
	free_node->next = lua_touserdata(L,-1);
	lua_pop(L,1);
	skynet_free(free_node->msg);
	free_node->msg = NULL;

	free_node->sz = 0;
	lua_pushlightuserdata(L, free_node);
	lua_rawseti(L, pool, 1);
}